

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

void xmlParseCommentComplex(xmlParserCtxtPtr ctxt,xmlChar *buf,size_t len,size_t size)

{
  xmlParserInputPtr pxVar1;
  commentSAXFunc p_Var2;
  uint uVar3;
  xmlParserCtxtPtr pxVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  size_t sVar9;
  xmlChar *pxVar10;
  char *msg;
  xmlParserErrors code;
  xmlChar *str1;
  int rl;
  int l;
  int ql;
  uint uVar11;
  undefined8 in_stack_ffffffffffffff98;
  int local_54;
  int local_50;
  int local_4c;
  xmlParserCtxtPtr local_48;
  size_t local_40;
  uint local_34;
  
  uVar11 = 1000000000;
  if ((ctxt->options & 0x80000) == 0) {
    uVar11 = 10000000;
  }
  local_40 = size;
  if (buf == (xmlChar *)0x0) {
    local_40 = 100;
    buf = (xmlChar *)(*xmlMalloc)(100);
    if (buf == (xmlChar *)0x0) {
      xmlCtxtErrMemory(ctxt);
      return;
    }
    len = 0;
  }
  local_34 = uVar11;
  uVar5 = xmlCurrentChar(ctxt,&local_4c);
  uVar11 = 0xfffd;
  if (uVar5 != 0x200000) {
    uVar11 = uVar5;
  }
  if (uVar11 == 0) {
LAB_0013706b:
    msg = "Comment not terminated\n";
LAB_00137072:
    pxVar10 = (xmlChar *)0x0;
    uVar11 = 0;
    code = XML_ERR_COMMENT_NOT_FINISHED;
  }
  else {
    if ((int)uVar11 < 0x100) {
      if (((int)uVar11 < 0x20) && ((0xd < uVar11 || ((0x2600U >> (uVar11 & 0x1f) & 1) == 0))))
      goto LAB_00136ddd;
LAB_00136d94:
      pxVar1 = ctxt->input;
      if (*pxVar1->cur == '\n') {
        pxVar1->line = pxVar1->line + 1;
        pxVar1->col = 1;
      }
      else {
        pxVar1->col = pxVar1->col + 1;
      }
      pxVar1->cur = pxVar1->cur + local_4c;
      uVar6 = xmlCurrentChar(ctxt,&local_54);
      uVar5 = 0xfffd;
      if (uVar6 != 0x200000) {
        uVar5 = uVar6;
      }
      if (uVar5 == 0) goto LAB_0013706b;
      if (0xff < (int)uVar5) {
        if (0xfffff < uVar5 - 0x10000 && (0x1ffd < uVar5 - 0xe000 && 0xd7ff < uVar5))
        goto LAB_00136eab;
LAB_00136e4c:
        pxVar1 = ctxt->input;
        if (*pxVar1->cur == '\n') {
          pxVar1->line = pxVar1->line + 1;
          pxVar1->col = 1;
        }
        else {
          pxVar1->col = pxVar1->col + 1;
        }
        pxVar1->cur = pxVar1->cur + local_54;
        uVar6 = xmlCurrentChar(ctxt,&local_50);
        if (uVar6 == 0x200000) {
          uVar6 = 0xfffd;
        }
        pxVar4 = ctxt;
        if (uVar6 != 0) {
LAB_00136efe:
          local_48 = pxVar4;
          uVar3 = uVar6;
          if ((int)uVar3 < 0x100) {
            if ((int)uVar3 < 0x20) {
              if ((0xd < uVar3) || ((0x2600U >> (uVar3 & 0x1f) & 1) == 0)) {
                buf[len] = '\0';
                if (uVar3 != 0) goto LAB_001370a5;
                msg = "Comment not terminated \n<!--%.50s\n";
                uVar11 = 0;
                code = XML_ERR_COMMENT_NOT_FINISHED;
                str1 = buf;
                pxVar10 = buf;
                goto LAB_001370d8;
              }
            }
            else if (((uVar11 == 0x2d) && (uVar5 == 0x2d)) && (uVar3 == 0x3e)) {
              buf[len] = '\0';
              xmlNextChar(ctxt);
              if (((ctxt->sax != (_xmlSAXHandler *)0x0) &&
                  (p_Var2 = ctxt->sax->comment, p_Var2 != (commentSAXFunc)0x0)) &&
                 (ctxt->disableSAX == 0)) {
                (*p_Var2)(ctxt->userData,buf);
              }
              goto LAB_001370e9;
            }
          }
          else if (0xfffff < uVar3 - 0x10000 && (0x1ffd < uVar3 - 0xe000 && 0xd7ff < uVar3)) {
            buf[len] = '\0';
LAB_001370a5:
            pxVar10 = (xmlChar *)CONCAT44((int)((ulong)in_stack_ffffffffffffff98 >> 0x20),uVar3);
            uVar11 = uVar3;
            goto LAB_001370b9;
          }
          if (uVar11 == 0x2d && uVar5 == 0x2d) {
            xmlFatalErr(ctxt,XML_ERR_HYPHEN_IN_COMMENT,(char *)0x0);
          }
          sVar9 = local_40;
          pxVar10 = buf;
          if (local_40 <= len + 5) {
            iVar8 = (int)local_40;
            if (iVar8 < 1) {
              sVar9 = 1;
            }
            else {
              if ((int)local_34 <= iVar8) {
                msg = "Comment too big found";
                goto LAB_00137072;
              }
              uVar7 = iVar8 + 1U >> 1;
              uVar6 = uVar7 + iVar8;
              if ((int)(local_34 - uVar7) < iVar8) {
                uVar6 = local_34;
              }
              sVar9 = (size_t)uVar6;
            }
            pxVar10 = (xmlChar *)(*xmlRealloc)(buf,sVar9);
            if (pxVar10 == (xmlChar *)0x0) goto LAB_001370fa;
          }
          local_40 = sVar9;
          if (uVar11 < 0x80) {
            pxVar10[len] = (xmlChar)uVar11;
            len = len + 1;
          }
          else {
            iVar8 = xmlCopyCharMultiByte(pxVar10 + len,uVar11);
            len = len + (long)iVar8;
          }
          ctxt = local_48;
          local_4c = local_54;
          local_54 = local_50;
          pxVar1 = local_48->input;
          if (*pxVar1->cur == '\n') {
            pxVar1->line = pxVar1->line + 1;
            pxVar1->col = 1;
          }
          else {
            pxVar1->col = pxVar1->col + 1;
          }
          pxVar1->cur = pxVar1->cur + local_50;
          uVar6 = xmlCurrentChar(local_48,&local_50);
          buf = pxVar10;
          uVar11 = uVar5;
          uVar5 = uVar3;
          pxVar4 = local_48;
          if (uVar6 == 0x200000) {
            uVar6 = 0xfffd;
          }
          goto LAB_00136efe;
        }
        goto LAB_0013706b;
      }
      if ((0x1f < (int)uVar5) || ((uVar5 < 0xe && ((0x2600U >> (uVar5 & 0x1f) & 1) != 0))))
      goto LAB_00136e4c;
LAB_00136eab:
      pxVar10 = (xmlChar *)CONCAT44((int)((ulong)in_stack_ffffffffffffff98 >> 0x20),uVar5);
      uVar11 = uVar5;
    }
    else {
      if (uVar11 - 0x10000 < 0x100000 || (uVar11 - 0xe000 < 0x1ffe || uVar11 < 0xd800))
      goto LAB_00136d94;
LAB_00136ddd:
      pxVar10 = (xmlChar *)CONCAT44((int)((ulong)in_stack_ffffffffffffff98 >> 0x20),uVar11);
    }
LAB_001370b9:
    msg = "xmlParseComment: invalid xmlChar value %d\n";
    code = XML_ERR_INVALID_CHAR;
  }
  str1 = (xmlChar *)0x0;
LAB_001370d8:
  xmlCtxtErr(ctxt,(xmlNodePtr)0x0,XML_FROM_PARSER,code,XML_ERR_FATAL,str1,(xmlChar *)0x0,
             (xmlChar *)0x0,uVar11,msg,pxVar10);
LAB_001370e9:
  (*xmlFree)(buf);
  return;
LAB_001370fa:
  xmlCtxtErrMemory(local_48);
  goto LAB_001370e9;
}

Assistant:

static void
xmlParseCommentComplex(xmlParserCtxtPtr ctxt, xmlChar *buf,
                       size_t len, size_t size) {
    int q, ql;
    int r, rl;
    int cur, l;
    int maxLength = (ctxt->options & XML_PARSE_HUGE) ?
                    XML_MAX_HUGE_LENGTH :
                    XML_MAX_TEXT_LENGTH;

    if (buf == NULL) {
        len = 0;
	size = XML_PARSER_BUFFER_SIZE;
	buf = xmlMalloc(size);
	if (buf == NULL) {
	    xmlErrMemory(ctxt);
	    return;
	}
    }
    q = xmlCurrentCharRecover(ctxt, &ql);
    if (q == 0)
        goto not_terminated;
    if (!IS_CHAR(q)) {
        xmlFatalErrMsgInt(ctxt, XML_ERR_INVALID_CHAR,
                          "xmlParseComment: invalid xmlChar value %d\n",
	                  q);
	xmlFree (buf);
	return;
    }
    NEXTL(ql);
    r = xmlCurrentCharRecover(ctxt, &rl);
    if (r == 0)
        goto not_terminated;
    if (!IS_CHAR(r)) {
        xmlFatalErrMsgInt(ctxt, XML_ERR_INVALID_CHAR,
                          "xmlParseComment: invalid xmlChar value %d\n",
	                  r);
	xmlFree (buf);
	return;
    }
    NEXTL(rl);
    cur = xmlCurrentCharRecover(ctxt, &l);
    if (cur == 0)
        goto not_terminated;
    while (IS_CHAR(cur) && /* checked */
           ((cur != '>') ||
	    (r != '-') || (q != '-'))) {
	if ((r == '-') && (q == '-')) {
	    xmlFatalErr(ctxt, XML_ERR_HYPHEN_IN_COMMENT, NULL);
	}
	if (len + 5 >= size) {
	    xmlChar *tmp;
            int newSize;

	    newSize = xmlGrowCapacity(size, 1, 1, maxLength);
            if (newSize < 0) {
                xmlFatalErrMsgStr(ctxt, XML_ERR_COMMENT_NOT_FINISHED,
                             "Comment too big found", NULL);
                xmlFree (buf);
                return;
            }
	    tmp = xmlRealloc(buf, newSize);
	    if (tmp == NULL) {
		xmlErrMemory(ctxt);
		xmlFree(buf);
		return;
	    }
	    buf = tmp;
            size = newSize;
	}
	COPY_BUF(buf, len, q);

	q = r;
	ql = rl;
	r = cur;
	rl = l;

	NEXTL(l);
	cur = xmlCurrentCharRecover(ctxt, &l);

    }
    buf[len] = 0;
    if (cur == 0) {
	xmlFatalErrMsgStr(ctxt, XML_ERR_COMMENT_NOT_FINISHED,
	                     "Comment not terminated \n<!--%.50s\n", buf);
    } else if (!IS_CHAR(cur)) {
        xmlFatalErrMsgInt(ctxt, XML_ERR_INVALID_CHAR,
                          "xmlParseComment: invalid xmlChar value %d\n",
	                  cur);
    } else {
        NEXT;
	if ((ctxt->sax != NULL) && (ctxt->sax->comment != NULL) &&
	    (!ctxt->disableSAX))
	    ctxt->sax->comment(ctxt->userData, buf);
    }
    xmlFree(buf);
    return;
not_terminated:
    xmlFatalErrMsgStr(ctxt, XML_ERR_COMMENT_NOT_FINISHED,
			 "Comment not terminated\n", NULL);
    xmlFree(buf);
}